

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON__EDGE_ENDS>::Move
          (ON_SimpleArray<ON__EDGE_ENDS> *this,int dest_i,int src_i,int ele_cnt)

{
  uint uVar1;
  uint uVar2;
  
  if ((((src_i != dest_i) && (0 < ele_cnt)) && (-1 < (src_i | dest_i))) &&
     (dest_i <= this->m_count && ele_cnt + src_i <= this->m_count)) {
    uVar1 = ele_cnt + dest_i;
    if (this->m_capacity < (int)uVar1) {
      uVar2 = this->m_capacity * 2;
      if ((int)uVar2 < (int)uVar1) {
        uVar2 = uVar1;
      }
      SetCapacity(this,(ulong)uVar2);
    }
    memmove(this->m_a + (uint)dest_i,this->m_a + (uint)src_i,(ulong)(uint)ele_cnt * 0xc);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Move( int dest_i, int src_i, int ele_cnt )
{
  // private function for moving blocks of array memory
  // caller is responsible for updating m_count.
  if ( ele_cnt <= 0 || src_i < 0 || dest_i < 0 || src_i == dest_i || 
       src_i + ele_cnt > m_count || dest_i > m_count )
    return;

  int capacity = dest_i + ele_cnt;
  if ( capacity > m_capacity ) {
    if ( capacity < 2*m_capacity )
      capacity = 2*m_capacity;
    SetCapacity( capacity );
  }

  memmove( (void*)&m_a[dest_i], (void*)&m_a[src_i], ele_cnt*sizeof(T) );
}